

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_400578::CpuIntegrationTest_stack_Test::TestBody
          (CpuIntegrationTest_stack_Test *this)

{
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  *this_00;
  mapped_type mVar1;
  void *pvVar2;
  FakeMmu *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  CpuIntegrationTest *pCVar5;
  uint8_t uVar6;
  int iVar7;
  mapped_type *pmVar8;
  short sVar9;
  key_type *__k;
  char *pcVar10;
  uint16_t addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  bool bVar12;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar;
  int total_cycles;
  byte local_71;
  AssertHelper local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  ulong uStack_48;
  int local_3c;
  CpuIntegrationTest *local_38;
  
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200998a00a000a2;
  uStack_48 = 0x68f5d010c0c8e848;
  __l._M_len = 0x10;
  __l._M_array = (iterator)&local_50;
  local_38 = &this->super_CpuIntegrationTest;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l,
             (allocator_type *)&local_3c);
  pbVar4 = local_60;
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pbVar11 != local_60) {
    pFVar3 = &local_38->mmu;
    sVar9 = 0x600;
    do {
      mVar1 = *(mapped_type *)&(pbVar11->_M_dataplus)._M_p;
      local_70.data_._0_2_ = sVar9;
      pmVar8 = std::
               map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
               ::operator[](&pFVar3->memory_,(key_type *)&local_70);
      sVar9 = sVar9 + 1;
      *pmVar8 = mVar1;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar11->_M_dataplus)._M_p + 1);
    } while (pbVar11 != pbVar4);
  }
  pvVar2 = (void *)CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_58 - (long)pvVar2);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf7d020c0c8020099
  ;
  uStack_48 = uStack_48 & 0xffffffffff000000;
  __l_00._M_len = 0xb;
  __l_00._M_array = (iterator)&local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l_00,
             (allocator_type *)&local_3c);
  pbVar4 = local_60;
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pbVar11 != local_60) {
    pFVar3 = &local_38->mmu;
    sVar9 = 0x610;
    do {
      mVar1 = *(mapped_type *)&(pbVar11->_M_dataplus)._M_p;
      local_70.data_._0_2_ = sVar9;
      pmVar8 = std::
               map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
               ::operator[](&pFVar3->memory_,(key_type *)&local_70);
      sVar9 = sVar9 + 1;
      *pmVar8 = mVar1;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar11->_M_dataplus)._M_p + 1);
    } while (pbVar11 != pbVar4);
  }
  pvVar2 = (void *)CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_58 - (long)pvVar2);
  }
  pCVar5 = local_38;
  this_00 = &(local_38->mmu).memory_;
  sVar9 = 0x200;
  do {
    local_68[0] = SUB21(sVar9,0);
    local_68[1] = (undefined1)((ushort)sVar9 >> 8);
    pmVar8 = std::
             map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
             ::operator[](this_00,(key_type *)local_68);
    *pmVar8 = 0xba;
    sVar9 = sVar9 + 1;
  } while (sVar9 != 0x221);
  local_68[0] = (internal)0xfc;
  local_68[1] = 0xff;
  pmVar8 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar8 = '\0';
  local_68[0] = (internal)0xfd;
  local_68[1] = 0xff;
  pmVar8 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar8 = '\x06';
  local_68[0] = (internal)0xfe;
  local_68[1] = 0xff;
  pmVar8 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar8 = 0xad;
  local_68[0] = (internal)0xff;
  local_68[1] = 0xff;
  __k = (key_type *)local_68;
  pmVar8 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,__k);
  *pmVar8 = 0xde;
  (pCVar5->expected).x = '\x10';
  (pCVar5->expected).y = ' ';
  (pCVar5->expected).sp = (pCVar5->registers).sp + 0xfd;
  (pCVar5->expected).pc = 0xdead;
  (pCVar5->expected).p = '\x03';
  local_3c = 0x239;
  iVar7 = CpuIntegrationTest::run_until_brk(pCVar5,(int)__k);
  local_50._M_head_impl._0_4_ = iVar7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_68,"total_cycles","run_until_brk()",&local_3c,(int *)&local_50);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xf6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&pCVar5->expected,&pCVar5->registers);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xf7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  pFVar3 = &pCVar5->mmu;
  local_71 = 0;
  do {
    uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,local_71 | 0x200);
    local_50._M_head_impl._0_1_ = uVar6;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)local_68,"i","mmu.read_byte(0x0200 + i)",&local_71,(uchar *)&local_50);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar10 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                 ,0xfb,pcVar10);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_71 = local_71 + 1;
  } while (local_71 < 0x10);
  addr = 0x210;
  iVar7 = 0xf;
  do {
    local_50._M_head_impl._0_4_ = iVar7;
    uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,addr);
    local_70.data_._0_2_ = CONCAT11(local_70.data_._1_1_,uVar6);
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)local_68,"0x0F - i","mmu.read_byte(0x0210 + i)",(int *)&local_50,
               (uchar *)&local_70);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar10 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                 ,0xff,pcVar10);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    addr = addr + 1;
    bVar12 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar12);
  local_50._M_head_impl._0_4_ = 6;
  uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,0x1ff);
  local_70.data_._0_2_ = CONCAT11(local_70.data_._1_1_,uVar6);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_68,"0x06","mmu.read_byte(kStackOffset + 0xFF)",(int *)&local_50,
             (uchar *)&local_70);
  pCVar5 = local_38;
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x104,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_50._M_head_impl._0_4_ = 0x1a;
  uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,0x1fe);
  local_70.data_._0_2_ = CONCAT11(local_70.data_._1_1_,uVar6);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_68,"0x18 + 2","mmu.read_byte(kStackOffset + 0xFE)",(int *)&local_50,
             (uchar *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x105,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT44(local_50._M_head_impl._4_4_,(uint)(pCVar5->expected).p) | 0x10);
  uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,0x1fd);
  local_70.data_._0_2_ = CONCAT11(local_70.data_._1_1_,uVar6);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_68,"expected.p | B_FLAG","mmu.read_byte(kStackOffset + 0xFD)",
             (int *)&local_50,(uchar *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x106,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_71 = 3;
  do {
    uVar6 = n_e_s::core::test::FakeMmu::read_byte(pFVar3,local_71 ^ 0x1ff);
    local_50._M_head_impl._0_1_ = uVar6;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)local_68,"i","mmu.read_byte(kStackOffset + 0xFF - i)",&local_71,
               (uchar *)&local_50);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar10 = "";
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                 ,0x109,pcVar10);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_71 = local_71 + 1;
  } while (local_71 < 0x10);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, stack) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    8a        TXA
    // $0605    99 00 02  STA $0200,Y
    // $0608    48        PHA
    // $0609    e8        INX
    // $060a    c8        INY
    // $060b    c0 10     CPY #$10
    // $060d    d0 f5     BNE $0604
    // $060f    68        PLA
    // $0610    99 00 02  STA $0200,Y
    // $0613    c8        INY
    // $0614    c0 20     CPY #$20
    // $0616    d0 f7     BNE $060f
    // $0618    00        BRK
    load_hex_dump(0x0600,
            {0xa2,
                    0x00,
                    0xa0,
                    0x00,
                    0x8a,
                    0x99,
                    0x00,
                    0x02,
                    0x48,
                    0xe8,
                    0xc8,
                    0xc0,
                    0x10,
                    0xd0,
                    0xf5,
                    0x68});
    load_hex_dump(0x0610,
            {0x99,
                    0x00,
                    0x02,
                    0xc8,
                    0xc0,
                    0x20,
                    0xd0,
                    0xf7,
                    0x00,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read

    // STA with absolute indexed addressing will first read from the effective
    // address before writing to it, so we need to initialize the fake mmu with
    // some data at those addresses.
    for (uint8_t i = 0; i <= 0x20; ++i) {
        mmu.write_byte(
                static_cast<uint16_t>(0x0200) + i, static_cast<uint8_t>(0xBA));
    }

    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.x = 0x10;
    expected.y = 0x20;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;
    expected.p = C_FLAG | Z_FLAG;

    const int pre_loop = 2 + 2;
    const int first_loop = (2 + 5 + 3 + 2 + 2 + 2) * 16 + 15 * 3 + 2;
    const int second_loop = (4 + 5 + 2 + 2) * 16 + 15 * 3 + 2;
    const int total_cycles = pre_loop + first_loop + second_loop + 7;

    EXPECT_EQ(total_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);

    // Written in first loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(0x0200 + i));
    }
    // Written in second loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(0x0F - i, mmu.read_byte(0x0210 + i));
    }
    // Verify stack content
    // BRK pushes three bytes (PC + 2 and P) and overwrites what the first loop
    // wrote.
    EXPECT_EQ(0x06, mmu.read_byte(kStackOffset + 0xFF));
    EXPECT_EQ(0x18 + 2, mmu.read_byte(kStackOffset + 0xFE));
    EXPECT_EQ(expected.p | B_FLAG, mmu.read_byte(kStackOffset + 0xFD));

    for (uint8_t i = 3; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(kStackOffset + 0xFF - i));
    }
}